

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O1

void __thiscall Rml::BaseXMLParser::ReadBody(BaseXMLParser *this)

{
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  String *pSVar4;
  String temp;
  String local_50;
  
  this->line_number_open_tag = 0;
  this->open_tag_depth = 0;
  bVar3 = FindString(this,"<",&this->data,true);
  if (bVar3) {
    do {
      sVar2 = this->xml_index;
      bVar3 = PeekString(this,"!--",true);
      if (bVar3) {
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        bVar3 = FindString(this,"-->",&local_50,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                   local_50.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar3) break;
      }
      else {
        bVar3 = PeekString(this,"![CDATA[",true);
        if (bVar3) {
          bVar3 = ReadCDATA(this,(char *)0x0);
        }
        else {
          bVar3 = PeekString(this,"/",true);
          if (bVar3) {
            bVar3 = ReadCloseTag(this,sVar2 - 1);
            if ((bVar3) && (this->open_tag_depth != 0)) goto LAB_001e2cd7;
            break;
          }
          bVar3 = ReadOpenTag(this);
        }
        if (bVar3 == false) break;
      }
LAB_001e2cd7:
      bVar3 = FindString(this,"<",&this->data,true);
    } while (bVar3);
  }
  if (0 < this->open_tag_depth) {
    uVar1 = this->line_number;
    pSVar4 = URL::GetURL_abi_cxx11_(this->source_url);
    Log::Message(LT_WARNING,"XML parse error on line %d of %s.",(ulong)uVar1,
                 (pSVar4->_M_dataplus)._M_p);
  }
  return;
}

Assistant:

void BaseXMLParser::ReadBody()
{
	RMLUI_ZoneScoped;

	open_tag_depth = 0;
	line_number_open_tag = 0;

	for (;;)
	{
		// Find the next open tag.
		if (!FindString("<", data, true))
			break;

		const size_t xml_index_tag = xml_index - 1;

		// Check what kind of tag this is.
		if (PeekString("!--"))
		{
			// Comment.
			String temp;
			if (!FindString("-->", temp))
				break;
		}
		else if (PeekString("![CDATA["))
		{
			// CDATA tag; read everything (including markup) until the ending
			// CDATA tag.
			if (!ReadCDATA())
				break;
		}
		else if (PeekString("/"))
		{
			if (!ReadCloseTag(xml_index_tag))
				break;

			// Bail if we've hit the end of the XML data.
			if (open_tag_depth == 0)
				break;
		}
		else
		{
			if (!ReadOpenTag())
				break;
		}
	}

	// Check for error conditions
	if (open_tag_depth > 0)
	{
		Log::Message(Log::LT_WARNING, "XML parse error on line %d of %s.", GetLineNumber(), source_url->GetURL().c_str());
	}
}